

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_import.c
# Opt level: O0

REF_STATUS ref_import_su2(REF_GRID *ref_grid_ptr,REF_MPI ref_mpi,char *filename)

{
  REF_GRID pRVar1;
  REF_NODE ref_node_00;
  REF_INT RVar2;
  REF_INT RVar3;
  REF_INT RVar4;
  int iVar5;
  uint uVar6;
  FILE *__stream;
  char **ppcVar7;
  char *pcVar8;
  REF_STATUS ref_private_macro_code_rss_12;
  REF_LONG ref_private_status_reis_bi_12;
  REF_LONG ref_private_status_reis_ai_12;
  REF_STATUS ref_private_macro_code_rss_11;
  REF_LONG ref_private_status_reis_bi_11;
  REF_LONG ref_private_status_reis_ai_11;
  REF_STATUS ref_private_macro_code_rss_10;
  REF_LONG ref_private_status_reis_bi_10;
  REF_LONG ref_private_status_reis_ai_10;
  REF_LONG ref_private_status_reis_bi_9;
  REF_LONG ref_private_status_reis_ai_9;
  REF_STATUS ref_private_macro_code_rss_9;
  REF_LONG ref_private_status_reis_bi_8;
  REF_LONG ref_private_status_reis_ai_8;
  REF_STATUS ref_private_macro_code_rss_8;
  REF_LONG ref_private_status_reis_bi_7;
  REF_LONG ref_private_status_reis_ai_7;
  REF_STATUS ref_private_macro_code_rss_7;
  REF_LONG ref_private_status_reis_bi_6;
  REF_LONG ref_private_status_reis_ai_6;
  REF_STATUS ref_private_macro_code_rss_6;
  REF_INT ugrid_nodes_1 [6];
  REF_LONG ref_private_status_reis_bi_5;
  REF_LONG ref_private_status_reis_ai_5;
  REF_STATUS ref_private_macro_code_rss_5;
  REF_INT ugrid_nodes [5];
  REF_LONG ref_private_status_reis_bi_4;
  REF_LONG ref_private_status_reis_ai_4;
  REF_STATUS ref_private_macro_code_rss_4;
  REF_LONG ref_private_status_reis_bi_3;
  REF_LONG ref_private_status_reis_ai_3;
  REF_LONG ref_private_status_reis_bi_2;
  REF_LONG ref_private_status_reis_ai_2;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_LONG ref_private_status_reis_bi_1;
  REF_LONG ref_private_status_reis_ai_1;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_LONG ref_private_status_reis_bi;
  REF_LONG ref_private_status_reis_ai;
  REF_STATUS ref_private_macro_code_rss;
  REF_INT faceid;
  REF_INT cell_type;
  REF_INT new_cell;
  REF_INT cell;
  REF_INT ncell;
  REF_INT nodes [27];
  int local_490;
  int local_48c;
  REF_INT new_node;
  REF_INT node;
  REF_DBL z;
  REF_DBL y;
  REF_DBL x;
  REF_INT nmark;
  REF_INT nelem;
  REF_INT npoin;
  REF_INT ndime;
  char *location;
  char line [1024];
  FILE *file;
  REF_NODE ref_node;
  REF_GRID ref_grid;
  char *filename_local;
  REF_MPI ref_mpi_local;
  REF_GRID *ref_grid_ptr_local;
  
  ref_grid_ptr_local._4_4_ = ref_grid_create(ref_grid_ptr,ref_mpi);
  if (ref_grid_ptr_local._4_4_ == 0) {
    pRVar1 = *ref_grid_ptr;
    ref_node_00 = pRVar1->node;
    __stream = fopen(filename,"r");
    if (__stream == (FILE *)0x0) {
      printf("unable to open %s\n",filename);
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c",
             0x333,"ref_import_su2","unable to open file");
      ref_grid_ptr_local._4_4_ = 2;
    }
    else {
      nelem = -1;
      while (iVar5 = feof(__stream), iVar5 == 0) {
        ppcVar7 = (char **)fgets((char *)&location,0x400,__stream);
        if (&location != ppcVar7) {
          return 0;
        }
        _npoin = strchr((char *)&location,0x3d);
        if (_npoin != (char *)0x0) {
          pcVar8 = strstr((char *)&location,"NDIME");
          if (pcVar8 != (char *)0x0) {
            nelem = atoi(_npoin + 1);
            printf("NDIME %d\n",(ulong)(uint)nelem);
            if (nelem == 2) {
              pRVar1->twod = 1;
            }
          }
          pcVar8 = strstr((char *)&location,"NPOIN");
          if (pcVar8 != (char *)0x0) {
            nmark = atoi(_npoin + 1);
            printf("NPOIN %d\n",(ulong)(uint)nmark);
            for (local_48c = 0; local_48c < nmark; local_48c = local_48c + 1) {
              ppcVar7 = (char **)fgets((char *)&location,0x400,__stream);
              if (&location != ppcVar7) {
                printf("%s: %d: %s: %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                       ,0x345,"ref_import_su2","unable to read point xyz line");
                return 1;
              }
              if (nelem == 2) {
                iVar5 = __isoc99_sscanf(&location,"%lf %lf",&y,&z);
                if ((long)iVar5 != 2) {
                  printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                         ,0x347,"ref_import_su2","parse xyz",2,(long)iVar5);
                  return 1;
                }
                uVar6 = ref_node_add(ref_node_00,(long)local_48c,&local_490);
                if (uVar6 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                         ,0x348,"ref_import_su2",(ulong)uVar6,"add node");
                  return uVar6;
                }
                ref_node_00->real[local_490 * 0xf] = y;
                ref_node_00->real[local_490 * 0xf + 1] = z;
                ref_node_00->real[local_490 * 0xf + 2] = 0.0;
              }
              else {
                iVar5 = __isoc99_sscanf(&location,"%lf %lf %lf",&y,&z,&new_node);
                if ((long)iVar5 != 3) {
                  printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                         ,0x34d,"ref_import_su2","parse xyz",3,(long)iVar5);
                  return 1;
                }
                uVar6 = ref_node_add(ref_node_00,(long)local_48c,&local_490);
                if (uVar6 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                         ,0x34e,"ref_import_su2",(ulong)uVar6,"add node");
                  return uVar6;
                }
                ref_node_00->real[local_490 * 0xf] = y;
                ref_node_00->real[local_490 * 0xf + 1] = z;
                ref_node_00->real[local_490 * 0xf + 2] = _new_node;
              }
            }
            uVar6 = ref_node_initialize_n_global(ref_node_00,(long)nmark);
            if (uVar6 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                     ,0x354,"ref_import_su2",(ulong)uVar6,"init glob");
              return uVar6;
            }
          }
          pcVar8 = strstr((char *)&location,"NELEM");
          if (pcVar8 != (char *)0x0) {
            x._4_4_ = atoi(_npoin + 1);
            printf("NELEM %d\n",(ulong)x._4_4_);
            for (cell_type = 0; cell_type < (int)x._4_4_; cell_type = cell_type + 1) {
              ppcVar7 = (char **)fgets((char *)&location,0x400,__stream);
              if (&location != ppcVar7) {
                printf("%s: %d: %s: %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                       ,0x35a,"ref_import_su2","unable to read element line");
                return 1;
              }
              iVar5 = __isoc99_sscanf(&location,"%d",&ref_private_macro_code_rss);
              if ((long)iVar5 != 1) {
                printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                       ,0x35b,"ref_import_su2","parse element type",1,(long)iVar5);
                return 1;
              }
              switch(ref_private_macro_code_rss) {
              case 5:
                iVar5 = __isoc99_sscanf(&location,"%d %d %d %d",&ref_private_macro_code_rss,&cell,
                                        &ncell,nodes);
                if ((long)iVar5 != 4) {
                  printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                         ,0x381,"ref_import_su2","parse marker element",4,(long)iVar5);
                  return 1;
                }
                nodes[1] = 0;
                uVar6 = ref_cell_add(pRVar1->cell[3],&cell,&faceid);
                if (uVar6 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                         ,899,"ref_import_su2",(ulong)uVar6,"tri");
                  return uVar6;
                }
                break;
              default:
                printf("cell_type = %d\n",(ulong)(uint)ref_private_macro_code_rss);
                printf("%s: %d: %s: %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                       ,0x390,"ref_import_su2","unknown SU2/VTK ELEM type");
                return 1;
              case 9:
                iVar5 = __isoc99_sscanf(&location,"%d %d %d %d %d",&ref_private_macro_code_rss,&cell
                                        ,&ncell,nodes,nodes + 1);
                if ((long)iVar5 != 5) {
                  printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                         ,0x389,"ref_import_su2","parse marker element",5,(long)iVar5);
                  return 1;
                }
                nodes[2] = 0;
                uVar6 = ref_cell_add(pRVar1->cell[6],&cell,&faceid);
                if (uVar6 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                         ,0x38b,"ref_import_su2",(ulong)uVar6,"tri");
                  return uVar6;
                }
                break;
              case 10:
                iVar5 = __isoc99_sscanf(&location,"%d %d %d %d %d",&ref_private_macro_code_rss,&cell
                                        ,&ncell,nodes,nodes + 1);
                if ((long)iVar5 != 5) {
                  printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                         ,0x361,"ref_import_su2","parse element",5,(long)iVar5);
                  return 1;
                }
                uVar6 = ref_cell_add(pRVar1->cell[8],&cell,&faceid);
                if (uVar6 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                         ,0x362,"ref_import_su2",(ulong)uVar6,"tet");
                  return uVar6;
                }
                break;
              case 0xc:
                iVar5 = __isoc99_sscanf(&location,"%d %d %d %d %d %d %d %d %d",
                                        &ref_private_macro_code_rss,&cell,&ncell,nodes,nodes + 1,
                                        nodes + 2,nodes + 3,nodes + 4,nodes + 5);
                if ((long)iVar5 != 9) {
                  printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                         ,0x37a,"ref_import_su2","parse element",9,(long)iVar5);
                  return 1;
                }
                uVar6 = ref_cell_add(pRVar1->cell[0xb],&cell,&faceid);
                if (uVar6 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                         ,0x37b,"ref_import_su2",(ulong)uVar6,"tri");
                  return uVar6;
                }
                break;
              case 0xd:
                iVar5 = __isoc99_sscanf(&location,"%d %d %d %d %d %d %d",&ref_private_macro_code_rss
                                        ,&cell,&ncell,nodes,nodes + 1,nodes + 2,nodes + 3);
                RVar3 = nodes[1];
                RVar2 = cell;
                if ((long)iVar5 != 7) {
                  printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                         ,0x371,"ref_import_su2","parse element",7,(long)iVar5);
                  return 1;
                }
                cell = ncell;
                ncell = RVar2;
                nodes[1] = nodes[2];
                nodes[2] = RVar3;
                uVar6 = ref_cell_add(pRVar1->cell[10],&cell,&faceid);
                if (uVar6 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                         ,0x373,"ref_import_su2",(ulong)uVar6,"tri");
                  return uVar6;
                }
                break;
              case 0xe:
                iVar5 = __isoc99_sscanf(&location,"%d %d %d %d %d %d",&ref_private_macro_code_rss,
                                        &cell,&ncell,nodes,nodes + 1,nodes + 2);
                RVar4 = nodes[1];
                RVar3 = nodes[0];
                RVar2 = cell;
                if ((long)iVar5 != 6) {
                  printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                         ,0x368,"ref_import_su2","parse element",6,(long)iVar5);
                  return 1;
                }
                cell = ncell;
                ncell = RVar2;
                nodes[0] = nodes[2];
                nodes[1] = RVar3;
                nodes[2] = RVar4;
                uVar6 = ref_cell_add(pRVar1->cell[9],&cell,&faceid);
                if (uVar6 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                         ,0x36a,"ref_import_su2",(ulong)uVar6,"pyr");
                  return uVar6;
                }
              }
            }
          }
          pcVar8 = strstr((char *)&location,"NMARK");
          if (pcVar8 != (char *)0x0) {
            x._0_4_ = atoi(_npoin + 1);
            printf("NMARK %d\n",(ulong)x._0_4_);
            for (ref_private_status_reis_ai._4_4_ = 1;
                (int)ref_private_status_reis_ai._4_4_ <= (int)x._0_4_;
                ref_private_status_reis_ai._4_4_ = ref_private_status_reis_ai._4_4_ + 1) {
              ppcVar7 = (char **)fgets((char *)&location,0x400,__stream);
              if (&location != ppcVar7) {
                printf("%s: %d: %s: %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                       ,0x398,"ref_import_su2","unable to read marker tag");
                return 1;
              }
              printf("%d: %s",(ulong)ref_private_status_reis_ai._4_4_,&location);
              pcVar8 = strstr((char *)&location,"MARKER_TAG");
              if (pcVar8 == (char *)0x0) {
                printf("%s: %d: %s: %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                       ,0x39a,"ref_import_su2","MARKER_TAG not found");
                return 1;
              }
              ppcVar7 = (char **)fgets((char *)&location,0x400,__stream);
              if (&location != ppcVar7) {
                printf("%s: %d: %s: %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                       ,0x39b,"ref_import_su2","unable to read marker elems");
                return 1;
              }
              pcVar8 = strstr((char *)&location,"MARKER_ELEMS");
              if (pcVar8 == (char *)0x0) {
                printf("%s: %d: %s: %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                       ,0x39c,"ref_import_su2","MARKER_ELEMS not found");
                return 1;
              }
              _npoin = strchr((char *)&location,0x3d);
              if (_npoin == (char *)0x0) {
                printf("%s: %d: %s: %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                       ,0x39e,"ref_import_su2","MARKER_ELEMS missing =");
                return 2;
              }
              new_cell = atoi(_npoin + 1);
              printf("%d: %s",(ulong)(uint)new_cell,&location);
              for (cell_type = 0; cell_type < new_cell; cell_type = cell_type + 1) {
                ppcVar7 = (char **)fgets((char *)&location,0x400,__stream);
                if (&location != ppcVar7) {
                  printf("%s: %d: %s: %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                         ,0x3a2,"ref_import_su2","unable to read marker line");
                  return 1;
                }
                iVar5 = __isoc99_sscanf(&location,"%d",&ref_private_macro_code_rss);
                if ((long)iVar5 != 1) {
                  printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                         ,0x3a3,"ref_import_su2","parse marker element type",1,(long)iVar5);
                  return 1;
                }
                if (ref_private_macro_code_rss == 3) {
                  iVar5 = __isoc99_sscanf(&location,"%d %d %d",&ref_private_macro_code_rss,&cell,
                                          &ncell);
                  if ((long)iVar5 != 3) {
                    printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                           ,0x3bb,"ref_import_su2","parse marker element",3,(long)iVar5);
                    return 1;
                  }
                  nodes[0] = ref_private_status_reis_ai._4_4_;
                  uVar6 = ref_cell_add(pRVar1->cell[0],&cell,&faceid);
                  if (uVar6 != 0) {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                           ,0x3be,"ref_import_su2",(ulong)uVar6,"edg");
                    return uVar6;
                  }
                }
                else if (ref_private_macro_code_rss == 5) {
                  iVar5 = __isoc99_sscanf(&location,"%d %d %d %d",&ref_private_macro_code_rss,&cell,
                                          &ncell,nodes);
                  if ((long)iVar5 != 4) {
                    printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                           ,0x3a9,"ref_import_su2","parse marker element",4,(long)iVar5);
                    return 1;
                  }
                  nodes[1] = ref_private_status_reis_ai._4_4_;
                  uVar6 = ref_cell_add(pRVar1->cell[3],&cell,&faceid);
                  if (uVar6 != 0) {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                           ,0x3ac,"ref_import_su2",(ulong)uVar6,"tri");
                    return uVar6;
                  }
                }
                else {
                  if (ref_private_macro_code_rss != 9) {
                    printf("cell_type = %d\n",(ulong)(uint)ref_private_macro_code_rss);
                    printf("%s: %d: %s: %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                           ,0x3c2,"ref_import_su2","unknown SU2/VTK MARKER ELEM type");
                    return 1;
                  }
                  iVar5 = __isoc99_sscanf(&location,"%d %d %d %d %d",&ref_private_macro_code_rss,
                                          &cell,&ncell,nodes,nodes + 1);
                  if ((long)iVar5 != 5) {
                    printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                           ,0x3b2,"ref_import_su2","parse marker element",5,(long)iVar5);
                    return 1;
                  }
                  nodes[2] = ref_private_status_reis_ai._4_4_;
                  uVar6 = ref_cell_add(pRVar1->cell[6],&cell,&faceid);
                  if (uVar6 != 0) {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                           ,0x3b5,"ref_import_su2",(ulong)uVar6,"tri");
                    return uVar6;
                  }
                }
              }
            }
          }
        }
      }
      fclose(__stream);
      ref_grid_ptr_local._4_4_ = 0;
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c",0x32d,
           "ref_import_su2",(ulong)ref_grid_ptr_local._4_4_,"create grid");
  }
  return ref_grid_ptr_local._4_4_;
}

Assistant:

REF_FCN static REF_STATUS ref_import_su2(REF_GRID *ref_grid_ptr,
                                         REF_MPI ref_mpi,
                                         const char *filename) {
  REF_GRID ref_grid;
  REF_NODE ref_node;
  FILE *file;
  char line[1024];
  char *location;
  REF_INT ndime, npoin, nelem, nmark;
  REF_DBL x, y, z;
  REF_INT node, new_node;
  REF_INT nodes[REF_CELL_MAX_SIZE_PER], ncell, cell, new_cell, cell_type;
  REF_INT faceid;

  RSS(ref_grid_create(ref_grid_ptr, ref_mpi), "create grid");
  ref_grid = (*ref_grid_ptr);
  ref_node = ref_grid_node(ref_grid);

  file = fopen(filename, "r");
  if (NULL == (void *)file) printf("unable to open %s\n", filename);
  RNS(file, "unable to open file");

  ndime = -1;
  while (!feof(file)) {
    if (line != fgets(line, 1024, file)) return REF_SUCCESS;
    location = strchr(line, '=');
    if (NULL == location) continue;
    if (NULL != strstr(line, "NDIME")) {
      ndime = atoi(location + 1);
      printf("NDIME %d\n", ndime);
      if (2 == ndime) {
        ref_grid_twod(ref_grid) = REF_TRUE;
      }
    }
    if (NULL != strstr(line, "NPOIN")) {
      npoin = atoi(location + 1);
      printf("NPOIN %d\n", npoin);
      for (node = 0; node < npoin; node++) {
        RAS(line == fgets(line, 1024, file), "unable to read point xyz line");
        if (2 == ndime) {
          REIS(2, sscanf(line, "%lf %lf", &x, &y), "parse xyz");
          RSS(ref_node_add(ref_node, node, &new_node), "add node");
          ref_node_xyz(ref_node, 0, new_node) = x;
          ref_node_xyz(ref_node, 1, new_node) = y;
          ref_node_xyz(ref_node, 2, new_node) = 0.0;
        } else {
          REIS(3, sscanf(line, "%lf %lf %lf", &x, &y, &z), "parse xyz");
          RSS(ref_node_add(ref_node, node, &new_node), "add node");
          ref_node_xyz(ref_node, 0, new_node) = x;
          ref_node_xyz(ref_node, 1, new_node) = y;
          ref_node_xyz(ref_node, 2, new_node) = z;
        }
      }
      RSS(ref_node_initialize_n_global(ref_node, npoin), "init glob");
    }
    if (NULL != strstr(line, "NELEM")) {
      nelem = atoi(location + 1);
      printf("NELEM %d\n", nelem);
      for (cell = 0; cell < nelem; cell++) {
        RAS(line == fgets(line, 1024, file), "unable to read element line");
        REIS(1, sscanf(line, "%d", &cell_type), "parse element type");
        switch (cell_type) {
          case VTK_TETRA:
            REIS(5,
                 sscanf(line, "%d %d %d %d %d", &cell_type, &(nodes[0]),
                        &(nodes[1]), &(nodes[2]), &(nodes[3])),
                 "parse element");
            RSS(ref_cell_add(ref_grid_tet(ref_grid), nodes, &new_cell), "tet");
            break;
          case VTK_PYRAMID:
            REIS(6,
                 sscanf(line, "%d %d %d %d %d %d", &cell_type, &(nodes[0]),
                        &(nodes[1]), &(nodes[2]), &(nodes[3]), &(nodes[4])),
                 "parse element");
            VTK_PYRAMID_TO_UGRID(nodes);
            RSS(ref_cell_add(ref_grid_pyr(ref_grid), nodes, &new_cell), "pyr");
            break;
          case VTK_WEDGE:
            REIS(7,
                 sscanf(line, "%d %d %d %d %d %d %d", &cell_type, &(nodes[0]),
                        &(nodes[1]), &(nodes[2]), &(nodes[3]), &(nodes[4]),
                        &(nodes[5])),
                 "parse element");
            VTK_WEDGE_TO_UGRID(nodes);
            RSS(ref_cell_add(ref_grid_pri(ref_grid), nodes, &new_cell), "tri");
            break;
          case VTK_HEXAHEDRON:
            REIS(9,
                 sscanf(line, "%d %d %d %d %d %d %d %d %d", &cell_type,
                        &(nodes[0]), &(nodes[1]), &(nodes[2]), &(nodes[3]),
                        &(nodes[4]), &(nodes[5]), &(nodes[6]), &(nodes[7])),
                 "parse element");
            RSS(ref_cell_add(ref_grid_hex(ref_grid), nodes, &new_cell), "tri");
            break;
          case VTK_TRIANGLE:
            REIS(4,
                 sscanf(line, "%d %d %d %d", &cell_type, &(nodes[0]),
                        &(nodes[1]), &(nodes[2])),
                 "parse marker element");
            nodes[3] = 0;
            RSS(ref_cell_add(ref_grid_tri(ref_grid), nodes, &new_cell), "tri");
            break;
          case VTK_QUAD:
            REIS(5,
                 sscanf(line, "%d %d %d %d %d", &cell_type, &(nodes[0]),
                        &(nodes[1]), &(nodes[2]), &(nodes[3])),
                 "parse marker element");
            nodes[4] = 0;
            RSS(ref_cell_add(ref_grid_qua(ref_grid), nodes, &new_cell), "tri");
            break;

          default:
            printf("cell_type = %d\n", cell_type);
            THROW("unknown SU2/VTK ELEM type");
        }
      }
    }
    if (NULL != strstr(line, "NMARK")) {
      nmark = atoi(location + 1);
      printf("NMARK %d\n", nmark);
      for (faceid = 1; faceid <= nmark; faceid++) {
        RAS(line == fgets(line, 1024, file), "unable to read marker tag");
        printf("%d: %s", faceid, line);
        RAS(NULL != strstr(line, "MARKER_TAG"), "MARKER_TAG not found");
        RAS(line == fgets(line, 1024, file), "unable to read marker elems");
        RAS(NULL != strstr(line, "MARKER_ELEMS"), "MARKER_ELEMS not found");
        location = strchr(line, '=');
        RNS(location, "MARKER_ELEMS missing =");
        ncell = atoi(location + 1);
        printf("%d: %s", ncell, line);
        for (cell = 0; cell < ncell; cell++) {
          RAS(line == fgets(line, 1024, file), "unable to read marker line");
          REIS(1, sscanf(line, "%d", &cell_type), "parse marker element type");
          switch (cell_type) {
            case VTK_TRIANGLE:
              REIS(4,
                   sscanf(line, "%d %d %d %d", &cell_type, &(nodes[0]),
                          &(nodes[1]), &(nodes[2])),
                   "parse marker element");
              nodes[3] = faceid;
              RSS(ref_cell_add(ref_grid_tri(ref_grid), nodes, &new_cell),
                  "tri");
              break;
            case VTK_QUAD:
              REIS(5,
                   sscanf(line, "%d %d %d %d %d", &cell_type, &(nodes[0]),
                          &(nodes[1]), &(nodes[2]), &(nodes[3])),
                   "parse marker element");
              nodes[4] = faceid;
              RSS(ref_cell_add(ref_grid_qua(ref_grid), nodes, &new_cell),
                  "tri");
              break;
            case VTK_LINE:
              REIS(3,
                   sscanf(line, "%d %d %d", &cell_type, &(nodes[0]),
                          &(nodes[1])),
                   "parse marker element");
              nodes[2] = faceid;
              RSS(ref_cell_add(ref_grid_edg(ref_grid), nodes, &new_cell),
                  "edg");
              break;
            default:
              printf("cell_type = %d\n", cell_type);
              THROW("unknown SU2/VTK MARKER ELEM type");
          }
        }
      }
    }
  }

  fclose(file);

  return REF_SUCCESS;
}